

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O0

void __thiscall
ConfidentialValue_Constractor_hex33_Test::ConfidentialValue_Constractor_hex33_Test
          (ConfidentialValue_Constractor_hex33_Test *this)

{
  ConfidentialValue_Constractor_hex33_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ConfidentialValue_Constractor_hex33_Test_00675478;
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_hex33) {
  // 33byte
  ConfidentialValue value(
      "09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226");
  EXPECT_STREQ(
      value.GetHex().c_str(),
      "09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226");
  EXPECT_EQ(value.GetData().GetDataSize(), 33);
  EXPECT_EQ(value.HasBlinding(), true);
  EXPECT_EQ(value.GetAmount().GetSatoshiValue(), 0);
}